

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O1

void losestr(int num,boolean force)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  
  iVar2 = (int)u.acurr.a[0];
  if (iVar2 - num < 3) {
    iVar1 = (num - iVar2) + 3;
    iVar3 = u.uhpmax;
    iVar4 = u.uhp;
    iVar5 = u.mhmax;
    iVar6 = u.mh;
    do {
      if (u.umonnum == u.umonster) {
        iVar4 = iVar4 + -6;
        iVar3 = iVar3 + -6;
        u.uhp = iVar4;
        u.uhpmax = iVar3;
      }
      else {
        iVar6 = iVar6 + -6;
        iVar5 = iVar5 + -6;
        u.mh = iVar6;
        u.mhmax = iVar5;
      }
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
    num = iVar2 + -3;
  }
  adjattrib(0,-num,force,1);
  return;
}

Assistant:

void losestr(int num, boolean force)
{
	int ustr = ABASE(A_STR) - num;

	while (ustr < 3) {
	    ++ustr;
	    --num;
	    if (Upolyd) {
		u.mh -= 6;
		u.mhmax -= 6;
	    } else {
		u.uhp -= 6;
		u.uhpmax -= 6;
	    }
	}
	adjattrib(A_STR, -num, force, 1);
}